

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_array_append_string_with_len(JSON_Array *array,char *string,size_t len)

{
  JSON_Status JVar1;
  JSON_Value *value;
  JSON_Status JVar2;
  
  value = json_value_init_string_with_len(string,len);
  JVar2 = -1;
  if (value != (JSON_Value *)0x0) {
    JVar1 = json_array_append_value(array,value);
    if (JVar1 == 0) {
      JVar2 = 0;
    }
    else {
      json_value_free(value);
    }
  }
  return JVar2;
}

Assistant:

JSON_Status json_array_append_string_with_len(JSON_Array *array, const char *string, size_t len) {
    JSON_Value *value = json_value_init_string_with_len(string, len);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}